

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O0

string * ADSBBase::FetchMsg_abi_cxx11_(char *buf)

{
  bool bVar1;
  JSON_Object *pJVar2;
  ulong uVar3;
  string *in_RDI;
  string s;
  JSON_Object *pObj;
  JSONRootPtr pRoot;
  unique_ptr<json_value_t,_void_(*)(json_value_t_*)> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  JSON_Object *in_stack_ffffffffffffff70;
  string *__a;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  
  __a = in_RDI;
  JSONRootPtr::JSONRootPtr((JSONRootPtr *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<json_value_t,_void_(*)(json_value_t_*)> *)0x17e816);
  if (bVar1) {
    std::unique_ptr<json_value_t,_void_(*)(json_value_t_*)>::get(in_stack_ffffffffffffff60);
    pJVar2 = json_object((JSON_Value *)0x17e849);
    if (pJVar2 == (JSON_Object *)0x0) {
      std::__cxx11::string::string((string *)in_RDI);
    }
    else {
      jog_s(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      pJVar2 = (JSON_Object *)&stack0xffffffffffffff9f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(allocator<char> *)__a);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::__cxx11::string::string((string *)in_RDI,(string *)&stack0xffffffffffffffa0);
      }
      else {
        jog_s(pJVar2,in_stack_ffffffffffffff68);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(allocator<char> *)__a);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9e);
      }
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
    }
  }
  else {
    std::__cxx11::string::string((string *)in_RDI);
  }
  JSONRootPtr::~JSONRootPtr((JSONRootPtr *)0x17e9c5);
  return __a;
}

Assistant:

std::string ADSBBase::FetchMsg (const char* buf)
{
    // try to interpret it as JSON, then fetch 'msg' field content
    JSONRootPtr pRoot (buf);
    if (!pRoot) return std::string();
    const JSON_Object* pObj = json_object(pRoot.get());
    if (!pObj) return std::string();
    const std::string s = jog_s(pObj, ADSBEX_MESSAGE);  // try 'message' first
    if (!s.empty())
        return s;
    else
        return jog_s(pObj, ADSBEX_MSG);                 // else try 'msg' as per documentation
}